

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.h
# Opt level: O0

GridHandle<pbrt::NanoVDBBuffer> *
nanovdb::io::readGrid<pbrt::NanoVDBBuffer>
          (string *fileName,string *gridName,int verbose,NanoVDBBuffer *buffer)

{
  byte bVar1;
  undefined1 uVar2;
  _Ios_Openmode _Var3;
  runtime_error *this;
  ostream *poVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  int in_ECX;
  string *in_RDX;
  string *in_RSI;
  GridHandle<pbrt::NanoVDBBuffer> *in_RDI;
  ifstream is;
  GridHandle<pbrt::NanoVDBBuffer> *handle;
  char *in_stack_fffffffffffffcc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcc8;
  undefined7 in_stack_fffffffffffffd00;
  undefined1 in_stack_fffffffffffffd07;
  char *in_stack_fffffffffffffd08;
  string local_2c8 [32];
  NanoVDBBuffer *in_stack_fffffffffffffd58;
  string *in_stack_fffffffffffffd60;
  istream *in_stack_fffffffffffffd68;
  string local_260 [48];
  undefined1 local_230 [532];
  int local_1c;
  string *local_18;
  string *local_10;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  _Var3 = std::operator|(_S_in,_S_bin);
  std::ifstream::ifstream(local_230,in_RSI,_Var3);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((char *)this,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00));
    std::operator+(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
    std::runtime_error::runtime_error(this,local_260);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  readGrid<pbrt::NanoVDBBuffer>
            (in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  if (local_1c != 0) {
    uVar2 = GridHandleBase::operator_cast_to_bool((GridHandleBase *)0x73d58c);
    if ((bool)uVar2) {
      poVar4 = std::operator<<((ostream *)&std::cout,"Read NanoGrid named \"");
      poVar4 = std::operator<<(poVar4,local_18);
      poVar4 = std::operator<<(poVar4,"\" from the file named \"");
      poVar4 = std::operator<<(poVar4,local_10);
      poVar4 = std::operator<<(poVar4,"\"");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cout,"File named \"");
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::operator<<(poVar4,local_10);
      std::operator+(in_stack_fffffffffffffd08,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(uVar2,in_stack_fffffffffffffd00));
      std::operator+(__lhs,in_stack_fffffffffffffcc0);
      poVar4 = std::operator<<((ostream *)__lhs,(string *)&stack0xfffffffffffffd58);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffd58);
      std::__cxx11::string::~string(local_2c8);
    }
  }
  std::ifstream::~ifstream(local_230);
  return in_RDI;
}

Assistant:

GridHandle<BufferT> readGrid(const std::string& fileName, const std::string& gridName, int verbose, const BufferT& buffer)
{
    std::ifstream is(fileName, std::ios::in | std::ios::binary);
    if (!is.is_open())
        throw std::runtime_error("Unable to open file named \"" + fileName + "\" for input");
    auto handle = readGrid<BufferT>(is, gridName, buffer);
    if (verbose) {
        if (handle) {
            std::cout << "Read NanoGrid named \"" << gridName << "\" from the file named \"" << fileName << "\"" << std::endl;
        } else {
            std::cout << "File named \"" << fileName << "\" does not contain a grid named \"" + gridName + "\"" << std::endl;
        }
    }
    return handle;// is converted to r-value and return value is move constructed.
}